

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_tcp_socket.c
# Opt level: O3

int amqp_tcp_socket_open(void *base,char *host,int port,timeval *timeout)

{
  int iVar1;
  int iVar2;
  
  iVar1 = amqp_open_socket_noblock(host,port,timeout);
  iVar2 = -1;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  *(int *)((long)base + 8) = iVar2;
  if (-1 < iVar1) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
amqp_tcp_socket_open(void *base, const char *host, int port, struct timeval *timeout)
{
  struct amqp_tcp_socket_t *self = (struct amqp_tcp_socket_t *)base;
  self->sockfd = amqp_open_socket_noblock(host, port, timeout);
  if (0 > self->sockfd) {
    int err = self->sockfd;
    self->sockfd = -1;
    return err;
  }
  return AMQP_STATUS_OK;
}